

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

bitview_t *
bwtil::load_bitview_from_file(bitview_t *__return_storage_ptr__,bitview_t *bv,size_t size,FILE *fp)

{
  size_t end;
  bitview_t *pbVar1;
  ulong begin;
  ulint x;
  bitview_t *local_38;
  
  begin = 0;
  local_38 = __return_storage_ptr__;
  while (end = begin + 0x40, end <= size) {
    fread(&x,8,1,(FILE *)fp);
    ::bv::internal::bitview<std::vector>::set(bv,begin,end,x);
    begin = end;
  }
  if (begin < size) {
    fread(&x,8,1,(FILE *)fp);
    ::bv::internal::bitview<std::vector>::set(bv,begin,size,x);
  }
  pbVar1 = local_38;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_38->_container,&bv->_container);
  return pbVar1;
}

Assistant:

inline bitview_t load_bitview_from_file(bitview_t & bv, size_t size, FILE * fp){

	ulint i = 0;
	ulint x;

	ulint numBytes;

	while(i+64<=size){

		numBytes=fread(&x, sizeof(ulint), 1, fp);
		assert(numBytes>0);

		bv.set(i,i+64,x);

		i+=64;

	}

	if(i<size){

		numBytes=fread(&x, sizeof(ulint), 1, fp);
		assert(numBytes>0);

		bv.set(i,size,x);

	}

	 numBytes++;
	return bv;

}